

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

int __thiscall
nv::FloatImage::clone(FloatImage *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  FloatImage *this_00;
  FloatImage *copy;
  FloatImage *this_local;
  
  this_00 = (FloatImage *)operator_new(0x20);
  FloatImage(this_00);
  this_00->m_width = this->m_width;
  this_00->m_height = this->m_height;
  this_00->m_componentNum = this->m_componentNum;
  this_00->m_count = this->m_count;
  if (this->m_mem != (float *)0x0) {
    allocate(this_00,this->m_componentNum,(uint)this->m_width,(uint)this->m_height);
    memcpy(this_00->m_mem,this->m_mem,(ulong)this->m_count << 2);
  }
  return (int)this_00;
}

Assistant:

FloatImage* FloatImage::clone() const
{
	FloatImage* copy = new FloatImage();
	copy->m_width = m_width;
	copy->m_height = m_height;
	copy->m_componentNum = m_componentNum;
	copy->m_count = m_count;
	
	if(m_mem)
	{
		copy->allocate(m_componentNum, m_width, m_height);
		memcpy(copy->m_mem, m_mem, m_count * sizeof(float));
	}
		
	return copy;
}